

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor_rational.hpp
# Opt level: O2

void __thiscall soplex::CLUFactorRational::initFactorRings(CLUFactorRational *this)

{
  int *piVar1;
  int *piVar2;
  Pring *pPVar3;
  Pring *pPVar4;
  Pring *pPVar5;
  Pring *pPVar6;
  int iVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  long lVar13;
  
  piVar1 = (this->row).perm;
  piVar2 = (this->col).perm;
  spx_alloc<soplex::CLUFactorRational::Pring*>(&(this->temp).pivot_col,this->thedim + 1);
  spx_alloc<soplex::CLUFactorRational::Pring*>(&(this->temp).pivot_colNZ,this->thedim + 1);
  spx_alloc<soplex::CLUFactorRational::Pring*>(&(this->temp).pivot_row,this->thedim + 1);
  spx_alloc<soplex::CLUFactorRational::Pring*>(&(this->temp).pivot_rowNZ,this->thedim + 1);
  iVar7 = this->thedim;
  pPVar3 = (this->temp).pivot_colNZ;
  pPVar4 = (this->temp).pivot_rowNZ;
  for (uVar9 = iVar7 - (this->temp).stage; -1 < (int)uVar9; uVar9 = uVar9 - 1) {
    pPVar3[uVar9].next = pPVar3 + uVar9;
    pPVar3[uVar9].prev = pPVar3 + uVar9;
    pPVar4[uVar9].next = pPVar4 + uVar9;
    pPVar4[uVar9].prev = pPVar4 + uVar9;
  }
  lVar12 = 0;
  lVar10 = 0;
  lVar13 = 0;
  lVar11 = 0;
  do {
    if (iVar7 <= lVar11) {
      return;
    }
    if (*(int *)((long)piVar1 + lVar10) < 0) {
      lVar8 = (long)*(int *)((long)(this->u).row.len + lVar10);
      if (lVar8 < 1) goto LAB_001688f3;
      pPVar4 = (this->temp).pivot_row;
      pPVar5 = (this->temp).pivot_rowNZ;
      pPVar6 = pPVar5[lVar8].next;
      pPVar3 = (Pring *)((long)&pPVar4->next + lVar12);
      (&pPVar4->next)[lVar10] = pPVar6;
      pPVar6->prev = pPVar3;
      (&pPVar4->prev)[lVar10] = pPVar5 + lVar8;
      pPVar5[lVar8].next = pPVar3;
      (&pPVar4->idx)[lVar10 * 2] = (int)lVar11;
      boost::multiprecision::backends::
      rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
      ::operator=((rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0u,0u,(boost::multiprecision::cpp_integer_type)1,(boost::multiprecision::cpp_int_check_type)0,std::allocator<unsigned_long_long>>>
                   *)((long)&(((this->temp).s_max.val.
                               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::rational_adaptor<boost::multiprecision::backends::cpp_int_backend<0U,_0U,_(boost::multiprecision::cpp_integer_type)1,_(boost::multiprecision::cpp_int_check_type)0,_std::allocator<unsigned_long_long>_>_>,_(boost::multiprecision::expression_template_option)1>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->m_backend).m_value +
                     lVar13),-1);
    }
    if (*(int *)((long)piVar2 + lVar10) < 0) {
      lVar8 = (long)*(int *)((long)(this->temp).s_cact + lVar10);
      if (lVar8 < 1) {
LAB_001688f3:
        this->stat = SINGULAR;
        return;
      }
      pPVar4 = (this->temp).pivot_col;
      pPVar5 = (this->temp).pivot_colNZ;
      pPVar6 = pPVar5[lVar8].next;
      pPVar3 = (Pring *)((long)&pPVar4->next + lVar12);
      (&pPVar4->next)[lVar10] = pPVar6;
      pPVar6->prev = pPVar3;
      (&pPVar4->prev)[lVar10] = pPVar5 + lVar8;
      pPVar5[lVar8].next = pPVar3;
      (&pPVar4->idx)[lVar10 * 2] = (int)lVar11;
      *(undefined4 *)((long)(this->temp).s_mark + lVar10) = 0;
    }
    lVar11 = lVar11 + 1;
    iVar7 = this->thedim;
    lVar13 = lVar13 + 0x40;
    lVar10 = lVar10 + 4;
    lVar12 = lVar12 + 0x20;
  } while( true );
}

Assistant:

inline void CLUFactorRational::initFactorRings()
{
   int i;
   int* rperm = row.perm;
   int* cperm = col.perm;
   CLUFactorRational::Pring* ring;

   assert(thedim >= 0);
   spx_alloc(temp.pivot_col,   thedim + 1);
   spx_alloc(temp.pivot_colNZ, thedim + 1);
   spx_alloc(temp.pivot_row,   thedim + 1);
   spx_alloc(temp.pivot_rowNZ, thedim + 1);

   for(i = thedim - temp.stage; i >= 0; --i)
   {
      initDR(temp.pivot_colNZ[i]);
      initDR(temp.pivot_rowNZ[i]);
   }

   for(i = 0; i < thedim; ++i)
   {
      if(rperm[i] < 0)
      {
         if(u.row.len[i] <= 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }

         ring = &(temp.pivot_rowNZ[u.row.len[i]]);

         init2DR(temp.pivot_row[i], *ring);
         temp.pivot_row[i].idx = i;
         temp.s_max[i] = -1;
      }

      if(cperm[i] < 0)
      {
         if(temp.s_cact[i] <= 0)
         {
            stat = SLinSolverRational::SINGULAR;
            return;
         }

         ring = &(temp.pivot_colNZ[temp.s_cact[i]]);

         init2DR(temp.pivot_col[i], *ring);
         temp.pivot_col[i].idx = i;
         temp.s_mark[i] = 0;
      }
   }
}